

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPolygonOffsetTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_0::UsageDisplacementTestCase::testPolygonOffset
          (UsageDisplacementTestCase *this)

{
  ostringstream *poVar1;
  ostringstream *poVar2;
  TextureFormat log;
  RenderContext *pRVar3;
  TestContext *testCtx;
  UsageDisplacementTestCase *pUVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  deBool dVar8;
  undefined4 extraout_var;
  TestError *this_00;
  float fVar10;
  long lVar11;
  void *pvVar12;
  float fVar13;
  Vec4 triangle [3];
  Surface referenceImage;
  Surface testImage;
  ProgramSources sources;
  Random rnd;
  ShaderProgram program;
  float local_324 [3];
  undefined1 local_318 [8];
  float afStack_310 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  Surface local_2e8;
  Surface local_2d0;
  UsageDisplacementTestCase *local_2b8;
  value_type local_2b0;
  undefined1 local_290 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278 [4];
  ios_base local_218 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_200;
  undefined1 local_1e0 [208];
  deRandom local_110;
  ShaderProgram local_100;
  long lVar9;
  
  deRandom_init(&local_110,0xdec0de);
  log = (TextureFormat)
        ((this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
        ->m_log;
  iVar5 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&local_2d0,iVar5,iVar5);
  iVar5 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&local_2e8,iVar5,iVar5);
  iVar5 = (*((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar5);
  pRVar3 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
  local_318 = (undefined1  [8])&local_308;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,"");
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b0,
             "varying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_FragColor = v_color;\n}\n",""
            );
  local_1e0[0x10] = 0;
  local_1e0._17_8_ = 0;
  local_1e0._0_8_ = (pointer)0x0;
  local_1e0[8] = 0;
  local_1e0._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_290,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_290,(value_type *)local_318);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_278,&local_2b0);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar3,(ProgramSources *)local_290);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1e0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_200);
  lVar11 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_290 + lVar11));
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if (local_318 != (undefined1  [8])&local_308) {
    operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
  }
  local_2b8 = this;
  uVar6 = (**(code **)(lVar9 + 0x780))(local_100.m_program.m_program,"a_position");
  uVar7 = (**(code **)(lVar9 + 0x780))(local_100.m_program.m_program,"a_color");
  if (local_100.m_program.m_info.linkOk != false) {
    (**(code **)(lVar9 + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(lVar9 + 0x1d0))(0x3f800000);
    (**(code **)(lVar9 + 0x188))(0x4100);
    (**(code **)(lVar9 + 0x1a00))(0,0,(local_2b8->super_PolygonOffsetTestCase).m_targetSize);
    (**(code **)(lVar9 + 0x1680))(local_100.m_program.m_program);
    (**(code **)(lVar9 + 0x5e0))(0xb71);
    (**(code **)(lVar9 + 0x5e0))(0x8037);
    (**(code **)(lVar9 + 0x610))(uVar6);
    (**(code **)(lVar9 + 0x1858))(0,0x3f800000,0,0x3f800000,uVar7);
    poVar1 = (ostringstream *)(local_290 + 8);
    local_290._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Framebuffer cleared, clear color = Black.",0x29);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_290,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_218);
    poVar1 = (ostringstream *)(local_290 + 8);
    local_290._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"POLYGON_OFFSET_FILL enabled.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_290,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_218);
    poVar1 = (ostringstream *)(local_290 + 8);
    fVar10 = 0.0;
    do {
      local_324[0] = fVar10;
      dVar8 = deRandom_getBool(&local_110);
      local_2f8 = 0;
      uStack_2f0 = 0;
      local_308._M_allocated_capacity = 0;
      local_308._8_8_ = 0;
      local_318._0_4_ = R;
      local_318._4_4_ = SNORM_INT8;
      afStack_310[0] = 0.0;
      afStack_310[1] = 0.0;
      fVar10 = *(float *)(&DAT_01a39cf0 + (ulong)(dVar8 == 1) * 4);
      lVar11 = 0xc;
      do {
        fVar13 = deRandom_getFloat(&local_110);
        local_324[2] = fVar13 + fVar13 + -1.0;
        local_324[1] = deRandom_getFloat(&local_110);
        fVar13 = deRandom_getFloat(&local_110);
        *(float *)((long)local_324 + lVar11) = local_324[2];
        *(float *)((long)local_324 + lVar11 + 4) = local_324[1] + local_324[1] + -1.0;
        *(undefined4 *)((long)local_324 + lVar11 + 8) = 0x3f000000;
        *(float *)(local_318 + lVar11) = fVar13 + 1.0;
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x3c);
      (**(code **)(lVar9 + 0x19f0))(uVar6,4,0x1406,0,0,local_318);
      local_290._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_290 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_290 + 8),"Setup triangle with random coordinates:",0x27);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_290,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_290 + 8));
      std::ios_base::~ios_base(local_218);
      lVar11 = 0xc;
      do {
        local_290._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tx=",3);
        std::ostream::_M_insert<double>((double)*(float *)((long)local_324 + lVar11));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ty=",3);
        std::ostream::_M_insert<double>((double)*(float *)((long)local_324 + lVar11 + 4));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tz=",3);
        std::ostream::_M_insert<double>((double)*(float *)((long)local_324 + lVar11 + 8));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tw=",3);
        std::ostream::_M_insert<double>((double)*(float *)(local_318 + lVar11));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_290,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_218);
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x3c);
      poVar2 = (ostringstream *)(local_290 + 8);
      local_290._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,
                 "Draw colorless triangle.\tState: DepthFunc = GL_ALWAYS, PolygonOffset(0, 0).",0x4b
                );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_290,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_218);
      (**(code **)(lVar9 + 0x4a0))(0x207);
      (**(code **)(lVar9 + 0x1028))(0,0);
      (**(code **)(lVar9 + 0x238))(0,0,0,0);
      (**(code **)(lVar9 + 0x538))(4,0,3);
      poVar2 = (ostringstream *)(local_290 + 8);
      local_290._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,
                 "Draw green triangle.\tState: DepthFunc = GL_EQUAL, PolygonOffset(0, ",0x43);
      std::ostream::_M_insert<double>((double)fVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,").",2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_290,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_218);
      (**(code **)(lVar9 + 0x4a0))(0x202);
      (**(code **)(lVar9 + 0x1028))(0,fVar10);
      (**(code **)(lVar9 + 0x238))(1,1,1,1);
      (**(code **)(lVar9 + 0x538))(4,0,3);
      local_290._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_290 + 8));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_290,(EndMessageToken *)&tcu::TestLog::EndMessage);
      fVar10 = local_324[0];
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_290 + 8));
      std::ios_base::~ios_base(local_218);
      fVar10 = (float)((int)fVar10 + 1);
    } while (fVar10 != 5.60519e-44);
    (**(code **)(lVar9 + 0x518))(uVar6);
    (**(code **)(lVar9 + 0x1680))(0);
    (**(code **)(lVar9 + 0x648))();
    pUVar4 = local_2b8;
    pRVar3 = ((local_2b8->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    local_318._0_4_ = RGBA;
    local_318._4_4_ = UNORM_INT8;
    pvVar12 = (void *)local_2d0.m_pixels.m_cap;
    if ((void *)local_2d0.m_pixels.m_cap != (void *)0x0) {
      pvVar12 = local_2d0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_290,(TextureFormat *)local_318,local_2d0.m_width,
               local_2d0.m_height,1,pvVar12);
    glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_290);
    glu::ShaderProgram::~ShaderProgram(&local_100);
    poVar1 = (ostringstream *)(local_290 + 8);
    local_290._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Expecting black framebuffer.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_290,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_218);
    local_100.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x300000008;
    pvVar12 = (void *)local_2e8.m_pixels.m_cap;
    if ((void *)local_2e8.m_pixels.m_cap != (void *)0x0) {
      pvVar12 = local_2e8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_290,(TextureFormat *)&local_100,local_2e8.m_width,
               local_2e8.m_height,1,pvVar12);
    local_100.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0;
    local_100.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
    tcu::clear((PixelBufferAccess *)local_290,(Vec4 *)&local_100);
    testCtx = (pUVar4->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    pRVar3 = ((pUVar4->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    local_100.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x300000008;
    if ((void *)local_2d0.m_pixels.m_cap != (void *)0x0) {
      local_2d0.m_pixels.m_cap = (size_t)local_2d0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_290,(TextureFormat *)&local_100,local_2d0.m_width,
               local_2d0.m_height,1,(void *)local_2d0.m_pixels.m_cap);
    local_318._0_4_ = RGBA;
    local_318._4_4_ = UNORM_INT8;
    if ((void *)local_2e8.m_pixels.m_cap != (void *)0x0) {
      local_2e8.m_pixels.m_cap = (size_t)local_2e8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_100,(TextureFormat *)local_318,local_2e8.m_width,
               local_2e8.m_height,1,(void *)local_2e8.m_pixels.m_cap);
    verifyImages((TestLog *)log,testCtx,pRVar3,(ConstPixelBufferAccess *)local_290,
                 (ConstPixelBufferAccess *)&local_100);
    tcu::Surface::~Surface(&local_2e8);
    tcu::Surface::~Surface(&local_2d0);
    return;
  }
  glu::operator<<((TestLog *)log,&local_100);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Shader compile failed.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fPolygonOffsetTests.cpp"
             ,0x1f8);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void UsageDisplacementTestCase::testPolygonOffset (void)
{
	using tcu::TestLog;

	de::Random			rnd				(0xdec0de);
	tcu::TestLog&		log				= m_testCtx.getLog();
	tcu::Surface		testImage		(m_targetSize, m_targetSize);
	tcu::Surface		referenceImage	(m_targetSize, m_targetSize);

	// render test image
	{
		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	program			(m_context.getRenderContext(), glu::makeVtxFragSources(s_shaderSourceVertex, s_shaderSourceFragment));
		const GLint					positionLoc		= gl.getAttribLocation(program.getProgram(), "a_position");
		const GLint					colorLoc		= gl.getAttribLocation(program.getProgram(), "a_color");
		const int					numIterations	= 40;

		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Shader compile failed.");
		}

		gl.clearColor				(0, 0, 0, 1);
		gl.clearDepthf				(1.0f);
		gl.clear					(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl.viewport					(0, 0, m_targetSize, m_targetSize);
		gl.useProgram				(program.getProgram());
		gl.enable					(GL_DEPTH_TEST);
		gl.enable					(GL_POLYGON_OFFSET_FILL);
		gl.enableVertexAttribArray	(positionLoc);
		gl.vertexAttrib4f			(colorLoc, 0.0f, 1.0f, 0.0f, 1.0f);

		log << TestLog::Message << "Framebuffer cleared, clear color = Black." << TestLog::EndMessage;
		log << TestLog::Message << "POLYGON_OFFSET_FILL enabled." << TestLog::EndMessage;

		// draw colorless (mask = 0,0,0) triangle at random* location, set offset and render green triangle with depthfunc = equal
		// *) w >= 1.0 and z in (-1, 1) range
		for (int iterationNdx = 0; iterationNdx < numIterations; ++iterationNdx)
		{
			const bool		offsetDirection = rnd.getBool();
			const float		offset = offsetDirection ? -1.0f : 1.0f;
			tcu::Vec4		triangle[3];

			for (int vertexNdx = 0; vertexNdx < DE_LENGTH_OF_ARRAY(triangle); ++vertexNdx)
				triangle[vertexNdx] = genRandomVec4(rnd);

			gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangle);

			log << TestLog::Message << "Setup triangle with random coordinates:" << TestLog::EndMessage;
			for (size_t ndx = 0; ndx < DE_LENGTH_OF_ARRAY(triangle); ++ndx)
				log << TestLog::Message
						<< "\tx=" << triangle[ndx].x()
						<< "\ty=" << triangle[ndx].y()
						<< "\tz=" << triangle[ndx].z()
						<< "\tw=" << triangle[ndx].w()
						<< TestLog::EndMessage;

			log << TestLog::Message << "Draw colorless triangle.\tState: DepthFunc = GL_ALWAYS, PolygonOffset(0, 0)." << TestLog::EndMessage;

			gl.depthFunc				(GL_ALWAYS);
			gl.polygonOffset			(0, 0);
			gl.colorMask				(GL_FALSE, GL_FALSE, GL_FALSE, GL_FALSE);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);

			// all fragments should have different Z => DepthFunc == GL_EQUAL fails with every fragment

			log << TestLog::Message << "Draw green triangle.\tState: DepthFunc = GL_EQUAL, PolygonOffset(0, " << offset << ")." << TestLog::EndMessage;

			gl.depthFunc				(GL_EQUAL);
			gl.polygonOffset			(0, offset);
			gl.colorMask				(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);

			log << TestLog::Message << TestLog::EndMessage; // empty line for clarity
		}

		gl.disableVertexAttribArray	(positionLoc);
		gl.useProgram				(0);
		gl.finish					();

		glu::readPixels(m_context.getRenderContext(), 0, 0, testImage.getAccess());
	}

	// render reference image
	log << TestLog::Message << "Expecting black framebuffer." << TestLog::EndMessage;
	tcu::clear(referenceImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	// compare
	verifyImages(log, m_testCtx, m_context.getRenderContext(), testImage.getAccess(), referenceImage.getAccess());
}